

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

BOOL __thiscall
Js::FunctionBody::GetMatchingStatementMap
          (FunctionBody *this,StatementData *data,int statementIndex,FunctionBody *inlinee)

{
  SmallSpanSequence *this_00;
  code *pcVar1;
  BOOL BVar2;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  undefined4 *puVar3;
  Type *pTVar4;
  bool bVar5;
  SmallSpanSequenceIter local_38;
  
  if (-1 < statementIndex) {
    if (inlinee == (FunctionBody *)0x0) {
      inlinee = this;
    }
    this_00 = (inlinee->m_sourceInfo).pSpanSequence;
    if (this_00 == (SmallSpanSequence *)0x0) {
      this_01 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
      if (this_01 ==
          (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xd6d,"(pStatementMaps)","pStatementMaps");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      bVar5 = false;
      BVar2 = 0;
      if (statementIndex <
          (this_01->
          super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).
          count) {
        pTVar4 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_01,statementIndex);
        data->sourceBegin = (pTVar4->ptr->sourceSpan).begin;
        pTVar4 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_01,statementIndex);
        data->bytecodeBegin = (pTVar4->ptr->byteCodeSpan).begin;
        BVar2 = 1;
        bVar5 = false;
      }
    }
    else {
      local_38._0_8_ = (ulong)(uint)this_00->baseValue << 0x20;
      local_38.accumulatedBytecodeBegin = 0;
      local_38.indexOfActualOffset = 0;
      BVar2 = SmallSpanSequence::Item(this_00,statementIndex,&local_38,data);
      bVar5 = BVar2 == 0;
      BVar2 = 1;
    }
    if (!bVar5) {
      return BVar2;
    }
  }
  return 0;
}

Assistant:

BOOL FunctionBody::GetMatchingStatementMap(StatementData &data, int statementIndex, FunctionBody *inlinee)
    {
        SourceInfo *si = &this->m_sourceInfo;
        if (inlinee)
        {
            si = &inlinee->m_sourceInfo;
            Assert(si);
        }

        if (statementIndex >= 0)
        {
            SmallSpanSequence *pSpanSequence = si->pSpanSequence;
            if (pSpanSequence)
            {
                SmallSpanSequenceIter iter;
                pSpanSequence->Reset(iter);

                if (pSpanSequence->Item(statementIndex, iter, data))
                {
                    return TRUE;
                }
            }
            else
            {
                StatementMapList* pStatementMaps = GetStatementMaps();
                Assert(pStatementMaps);
                if (statementIndex >= pStatementMaps->Count())
                {
                    return FALSE;
                }

                data.sourceBegin = pStatementMaps->Item(statementIndex)->sourceSpan.begin;
                data.bytecodeBegin = pStatementMaps->Item(statementIndex)->byteCodeSpan.begin;
                return TRUE;
            }
        }

        return FALSE;
    }